

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O2

void test_notify_single_fd_multiple_events_remove_from_loop(void)

{
  cio_error cVar1;
  cio_event_notifier *evn;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [2];
  cio_eventloop loop;
  
  epoll_ctl_fake.custom_fake_seq = epoll_ctrl_fakes;
  epoll_wait_fake.custom_fake = notify_single_fd_multiple_events;
  epoll_ctrl_fakes[0] = epoll_ctl_nosave;
  epoll_ctrl_fakes[1] = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq_len = 2;
  epoll_callback_remove_loop_fake.custom_fake = remove_from_loop;
  memset(&loop,0,0x4e8);
  cVar1 = cio_eventloop_init(&loop);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x2d7,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x2d8,UNITY_DISPLAY_STYLE_INT);
  evn = (cio_event_notifier *)malloc(0x20);
  if (evn != (cio_event_notifier *)0x0) {
    evn->fd = 0x2a;
    evn->read_callback = epoll_callback_remove_loop;
    evn->write_callback = epoll_callback;
    evn->context = &loop;
    cVar1 = cio_linux_eventloop_add(&loop,evn);
    UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x2e4,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (3,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x2e5,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((long)loop.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x2e6,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x2e7,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x2e8,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_linux_eventloop_register_read(&loop,evn);
    UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x2eb,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x2ec,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((long)loop.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x2ed,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x2ee,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x2ef,UNITY_DISPLAY_STYLE_INT);
    cio_eventloop_run(&loop);
    UnityAssertEqualNumber
              (1,(ulong)epoll_callback_remove_loop_fake.call_count,(char *)0x0,0x2f2,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)&loop,(UNITY_INT)epoll_callback_remove_loop_fake.arg0_val,(char *)0x0,
               0x2f3,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)epoll_callback_fake.call_count,(char *)0x0,0x2f5,UNITY_DISPLAY_STYLE_INT);
    cio_eventloop_destroy(&loop);
    UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x2f8,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail("Could not allocate memory for test ev!",0x2dd);
}

Assistant:

static void test_notify_single_fd_multiple_events_remove_from_loop(void)
{
	epoll_wait_fake.custom_fake = notify_single_fd_multiple_events;
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_nosave, epoll_ctl_save};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	epoll_callback_remove_loop_fake.custom_fake = remove_from_loop;

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	static const int fake_fd = 42;
	struct cio_event_notifier *ev = malloc(sizeof(*ev));
	if (ev == NULL) {
		TEST_FAIL_MESSAGE("Could not allocate memory for test ev!");
	}
	ev->fd = fake_fd;
	ev->read_callback = epoll_callback_remove_loop;
	ev->write_callback = epoll_callback;
	ev->context = &loop;
	err = cio_linux_eventloop_add(&loop, ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(3, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	err = cio_linux_eventloop_register_read(&loop, ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_run(&loop);
	TEST_ASSERT_EQUAL(1, epoll_callback_remove_loop_fake.call_count);
	TEST_ASSERT_EQUAL(&loop, epoll_callback_remove_loop_fake.arg0_val);

	TEST_ASSERT_EQUAL(0, epoll_callback_fake.call_count);

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}